

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fastpfor.h
# Opt level: O2

void __thiscall FastPForLib::FastPFor<4U>::~FastPFor(FastPFor<4U> *this)

{
  ~FastPFor(this);
  operator_delete(this);
  return;
}

Assistant:

FastPFor(uint32_t pageSize = 65536) : pfor32(pageSize) {}